

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

void __thiscall
cppcms::util::urlencode_impl<std::ostreambuf_iterator<char,std::char_traits<char>>>
          (util *this,char *b,char *e,ostreambuf_iterator<char,_std::char_traits<char>_> out)

{
  util __c;
  ostreambuf_iterator<char,_std::char_traits<char>_> out_local;
  
  out_local._M_failed = out._M_sbuf._0_1_;
  out_local._M_sbuf = (streambuf_type *)e;
  for (; this != (util *)b; this = this + 1) {
    __c = *this;
    if ((((9 < (byte)((char)__c - 0x30U)) && (0x19 < (byte)(((byte)__c & 0xdf) + 0xbf))) &&
        (1 < (byte)__c - 0x2d)) && ((__c != (util)0x5f && (__c != (util)0x7e)))) {
      std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(&out_local,'%');
      std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=
                (&out_local,"0123456789abcdef"[(byte)__c >> 4]);
      __c = *(util *)("0123456789abcdef" + ((byte)__c & 0xf));
    }
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(&out_local,(char)__c);
  }
  return;
}

Assistant:

void urlencode_impl(char const *b,char const *e,Iterator out)
{
	while(b!=e){
		char c=*b++;
		if(	('a'<=c && c<='z')
			|| ('A'<=c && c<='Z')
			|| ('0'<=c && c<='9'))
		{
			*out++ = c;
		}
		else {
			switch(c) {
				case '-':
				case '_':
				case '.':
				case '~':
					*out++ = c;
					break;
				default:
				{
					static char const hex[]="0123456789abcdef";
					unsigned char uc = c;
					*out++ = '%';
					*out++ = hex[(uc >> 4) & 0xF];
					*out++ = hex[ uc & 0xF];
					
				}
			};
		}
	};
}